

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringDatatypeValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::StringDatatypeValidator::checkAdditionalFacet
          (StringDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  short sVar1;
  bool bVar2;
  InvalidDatatypeValueException *this_00;
  
  if (((this->super_AbstractStringValidator).super_DatatypeValidator.fFacetsDefined & 0x4000) != 0)
  {
    sVar1 = (this->super_AbstractStringValidator).super_DatatypeValidator.fWhiteSpace;
    if (sVar1 == 2) {
      bVar2 = XMLString::isWSCollapsed(content);
      if (!bVar2) {
        this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
                   ,0xb3,VALUE_WS_collapsed,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
LAB_002f3e2d:
        __cxa_throw(this_00,&InvalidDatatypeValueException::typeinfo,XMLException::~XMLException);
      }
    }
    else if (sVar1 == 1) {
      bVar2 = XMLString::isWSReplaced(content);
      if (!bVar2) {
        this_00 = (InvalidDatatypeValueException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeValueException::InvalidDatatypeValueException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/StringDatatypeValidator.cpp"
                   ,0xae,VALUE_WS_replaced,content,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002f3e2d;
      }
    }
  }
  return;
}

Assistant:

void StringDatatypeValidator::checkAdditionalFacet(const XMLCh* const content
                                                   , MemoryManager* const manager) const
{
    //
    // check WhiteSpace
    //
    if ((getFacetsDefined() & DatatypeValidator::FACET_WHITESPACE) != 0 )
    {
        if ( getWSFacet() == DatatypeValidator::REPLACE )
        {
            if (!XMLString::isWSReplaced(content))
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_WS_replaced, content, manager);
        }
        else if ( getWSFacet() == DatatypeValidator::COLLAPSE )
        {
            if (!XMLString::isWSCollapsed(content))
                ThrowXMLwithMemMgr1(InvalidDatatypeValueException, XMLExcepts::VALUE_WS_collapsed, content, manager);
        }

    }
}